

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gfxwrapper_opengl.c
# Opt level: O2

_Bool GlCheckExtension(char *extension)

{
  code *pcVar1;
  char *__s1;
  int iVar2;
  GLint GVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  pcVar1 = (code *)glXGetProcAddress("glGetStringi");
  GVar3 = glGetInteger(0x821d);
  GlCheckErrors("const GLint numExtensions = glGetInteger(GL_NUM_EXTENSIONS)");
  iVar2 = 0;
  iVar6 = 0;
  if (0 < GVar3) {
    iVar6 = GVar3;
  }
  do {
    iVar5 = iVar2;
    if (iVar6 == iVar5) break;
    __s1 = (char *)(*pcVar1)(0x1f03,iVar5);
    GlCheckErrors("const GLubyte *string = glGetStringi(GL_EXTENSIONS, i)");
    iVar4 = strcmp(__s1,extension);
    iVar2 = iVar5 + 1;
  } while (iVar4 != 0);
  return iVar5 < GVar3;
}

Assistant:

static bool GlCheckExtension(const char *extension) {
#if defined(OS_WINDOWS) || defined(OS_LINUX)
    PFNGLGETSTRINGIPROC glGetStringi = (PFNGLGETSTRINGIPROC)GetExtension("glGetStringi");
#endif
    GL(const GLint numExtensions = glGetInteger(GL_NUM_EXTENSIONS));
    for (int i = 0; i < numExtensions; i++) {
        GL(const GLubyte *string = glGetStringi(GL_EXTENSIONS, i));
        if (strcmp((const char *)string, extension) == 0) {
            return true;
        }
    }
    return false;
}